

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::CalcResidualT<double>
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this,TPZElementMatrixT<double> *ef)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long *plVar7;
  ostream *poVar8;
  int64_t iVar9;
  TPZCompElSide *this_00;
  TPZCompEl *pTVar10;
  int64_t iVar11;
  TPZMaterialDataT<double> *pTVar12;
  int *piVar13;
  TPZGeoEl *pTVar14;
  TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this_01;
  TPZIntPoints *pTVar15;
  long in_RSI;
  long *in_RDI;
  int imesh;
  int int_ind;
  int nmeshes;
  REAL detJac;
  TPZFMatrix<double> jacInv;
  TPZFMatrix<double> axe;
  TPZFMatrix<double> jac;
  int intrulepoints;
  TPZManVector<int,_3> intorder;
  TPZGeoEl *ref;
  int order;
  int svec;
  TPZInterpolationSpace *msp;
  int64_t iref;
  TPZManVector<int,_3> ordervec;
  REAL weight;
  TPZManVector<double,_3> intpointtemp;
  TPZManVector<double,_3> intpoint;
  TPZAutoPointer<TPZIntPoints> intrule;
  int dim;
  TPZManVector<TPZTransform<double>,_10> trvec;
  int64_t nref;
  TPZManVector<TPZMaterialDataT<double>,_3> datavec;
  TPZMatCombinedSpacesT<double> *matCombined;
  TPZMaterial *material;
  uint in_stack_fffffffffffe6538;
  undefined4 in_stack_fffffffffffe653c;
  TPZVec<TPZMaterialDataT<double>_> *in_stack_fffffffffffe6540;
  MType type;
  TPZCompMesh *in_stack_fffffffffffe6548;
  undefined4 in_stack_fffffffffffe6550;
  undefined4 in_stack_fffffffffffe6554;
  int64_t in_stack_fffffffffffe6558;
  TPZGeoEl *rval;
  undefined4 in_stack_fffffffffffe6560;
  undefined4 in_stack_fffffffffffe6564;
  TPZVec<TPZMaterialDataT<double>_> *in_stack_fffffffffffe6568;
  undefined4 in_stack_fffffffffffe6570;
  int in_stack_fffffffffffe6574;
  long *plStack_19a68;
  int iStack_19a2c;
  undefined4 in_stack_fffffffffffe65d8;
  uint uVar16;
  uint uVar17;
  undefined4 in_stack_fffffffffffe65dc;
  TPZManVector<TPZMaterialDataT<double>,_3> *in_stack_fffffffffffe65e0;
  TPZFMatrix<double> *in_stack_fffffffffffe6638;
  REAL *in_stack_fffffffffffe6640;
  TPZFMatrix<double> *in_stack_fffffffffffe6648;
  TPZFMatrix<double> *in_stack_fffffffffffe6650;
  TPZVec<double> *in_stack_fffffffffffe6658;
  TPZGeoEl *in_stack_fffffffffffe6660;
  undefined1 auStack_19860 [48];
  TPZGeoEl *pTStack_19830;
  undefined4 uStack_19828;
  int iStack_19824;
  long *plStack_19820;
  int64_t iStack_19818;
  TPZVec<int> TStack_19810;
  double adStack_197e0 [2];
  undefined1 auStack_197d0 [56];
  undefined8 uStack_19798;
  TPZAutoPointer<TPZIntPoints> TStack_19758;
  undefined4 uStack_1974c;
  undefined1 auStack_19748 [160];
  size_t in_stack_fffffffffffe6958;
  char *in_stack_fffffffffffe6960;
  TPZVec<TPZMaterialDataT<double>_> aTStack_186d0 [3126];
  
  lVar6 = (**(code **)(*in_RDI + 0xb8))();
  if ((lVar6 == 0) ||
     (plVar7 = (long *)__dynamic_cast(lVar6,&TPZMaterial::typeinfo,
                                      &TPZMatCombinedSpacesT<double>::typeinfo,0xfffffffffffffffe),
     plVar7 == (long *)0x0)) {
    type = (MType)((ulong)in_stack_fffffffffffe6540 >> 0x20);
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error at ");
    poVar8 = std::operator<<(poVar8,
                             "void TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::CalcResidualT(TPZElementMatrixT<TVar> &) [TGeometry = pzgeom::TPZGeoCube, TVar = double]"
                            );
    std::operator<<(poVar8," this->Material() == NULL\n");
    TPZElementMatrixT<double>::Reset
              ((TPZElementMatrixT<double> *)
               CONCAT44(in_stack_fffffffffffe6554,in_stack_fffffffffffe6550),
               in_stack_fffffffffffe6548,type);
  }
  else {
    (**(code **)(*in_RDI + 0x100))(in_RDI,in_RSI);
    iVar1 = (**(code **)(*in_RDI + 0x90))();
    if (iVar1 != 0) {
      TPZManVector<TPZMaterialDataT<double>,_3>::TPZManVector
                (in_stack_fffffffffffe65e0,
                 CONCAT44(in_stack_fffffffffffe65dc,in_stack_fffffffffffe65d8));
      iVar9 = TPZVec<TPZCompElSide>::size((TPZVec<TPZCompElSide> *)(in_RDI + 0xf));
      TPZVec<TPZMaterialDataT<double>_>::resize
                (in_stack_fffffffffffe6540,
                 CONCAT44(in_stack_fffffffffffe653c,in_stack_fffffffffffe6538));
      (**(code **)(*in_RDI + 0x288))(in_RDI,aTStack_186d0,0);
      TPZManVector<TPZTransform<double>,_10>::TPZManVector
                ((TPZManVector<TPZTransform<double>,_10> *)in_stack_fffffffffffe65e0,
                 CONCAT44(in_stack_fffffffffffe65dc,in_stack_fffffffffffe65d8));
      (**(code **)(*in_RDI + 0x280))(in_RDI,auStack_19748);
      uStack_1974c = (**(code **)(*in_RDI + 0xb0))();
      TPZAutoPointer<TPZIntPoints>::TPZAutoPointer
                ((TPZAutoPointer<TPZIntPoints> *)
                 CONCAT44(in_stack_fffffffffffe6554,in_stack_fffffffffffe6550));
      uStack_19798 = 0;
      TPZManVector<double,_3>::TPZManVector
                ((TPZManVector<double,_3> *)
                 CONCAT44(in_stack_fffffffffffe6574,in_stack_fffffffffffe6570),
                 (int64_t)in_stack_fffffffffffe6568,
                 (double *)CONCAT44(in_stack_fffffffffffe6564,in_stack_fffffffffffe6560));
      adStack_197e0[1] = 0.0;
      TPZManVector<double,_3>::TPZManVector
                ((TPZManVector<double,_3> *)
                 CONCAT44(in_stack_fffffffffffe6574,in_stack_fffffffffffe6570),
                 (int64_t)in_stack_fffffffffffe6568,
                 (double *)CONCAT44(in_stack_fffffffffffe6564,in_stack_fffffffffffe6560));
      adStack_197e0[0] = 0.0;
      TPZManVector<int,_3>::TPZManVector
                ((TPZManVector<int,_3> *)
                 CONCAT44(in_stack_fffffffffffe6564,in_stack_fffffffffffe6560),
                 in_stack_fffffffffffe6558);
      for (iStack_19818 = 0; iStack_19818 < iVar9; iStack_19818 = iStack_19818 + 1) {
        this_00 = TPZVec<TPZCompElSide>::operator[]
                            ((TPZVec<TPZCompElSide> *)(in_RDI + 0xf),iStack_19818);
        pTVar10 = TPZCompElSide::Element(this_00);
        if (pTVar10 == (TPZCompEl *)0x0) {
          plStack_19a68 = (long *)0x0;
        }
        else {
          plStack_19a68 =
               (long *)__dynamic_cast(pTVar10,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,
                                      0);
        }
        plStack_19820 = plStack_19a68;
        if (plStack_19a68 != (long *)0x0) {
          TPZVec<int>::size(&TStack_19810);
          TPZManVector<int,_3>::Resize
                    ((TPZManVector<int,_3> *)
                     CONCAT44(in_stack_fffffffffffe6574,in_stack_fffffffffffe6570),
                     (int64_t)in_stack_fffffffffffe6568);
          iVar11 = TPZVec<int>::size(&TStack_19810);
          iStack_19824 = (int)iVar11;
          iVar1 = (**(code **)(*plStack_19820 + 0x268))();
          in_stack_fffffffffffe6568 = aTStack_186d0;
          pTVar12 = TPZVec<TPZMaterialDataT<double>_>::operator[]
                              (in_stack_fffffffffffe6568,iStack_19818);
          (pTVar12->super_TPZMaterialData).p = iVar1;
          pTVar12 = TPZVec<TPZMaterialDataT<double>_>::operator[]
                              (in_stack_fffffffffffe6568,iStack_19818);
          in_stack_fffffffffffe6574 = (pTVar12->super_TPZMaterialData).p;
          piVar13 = TPZVec<int>::operator[](&TStack_19810,(long)(iStack_19824 + -1));
          *piVar13 = in_stack_fffffffffffe6574;
        }
      }
      uVar2 = (**(code **)(*plVar7 + 0x48))(plVar7,&TStack_19810);
      uStack_19828 = uVar2;
      pTVar14 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffe6548);
      rval = pTVar14;
      pTStack_19830 = pTVar14;
      iVar3 = (**(code **)(*(long *)pTVar14 + 0xf0))();
      this_01 = (TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *)
                (**(code **)(*(long *)pTVar14 + 0x70))(pTVar14,iVar3 + -1,uStack_19828);
      TPZAutoPointer<TPZIntPoints>::operator=
                ((TPZAutoPointer<TPZIntPoints> *)CONCAT44(uVar2,in_stack_fffffffffffe6560),
                 (TPZIntPoints *)rval);
      TPZManVector<int,_3>::TPZManVector
                ((TPZManVector<int,_3> *)
                 CONCAT44(in_stack_fffffffffffe6574,in_stack_fffffffffffe6570),
                 (int64_t)in_stack_fffffffffffe6568,(int *)CONCAT44(uVar2,in_stack_fffffffffffe6560)
                );
      pTVar15 = TPZAutoPointer<TPZIntPoints>::operator->(&TStack_19758);
      (*pTVar15->_vptr_TPZIntPoints[5])(pTVar15,auStack_19860,0);
      pTVar15 = TPZAutoPointer<TPZIntPoints>::operator->(&TStack_19758);
      iVar4 = (*pTVar15->_vptr_TPZIntPoints[3])();
      iVar1 = iVar4;
      if (1000 < iVar4) {
        pzinternal::DebugStopImpl(in_stack_fffffffffffe6960,in_stack_fffffffffffe6958);
      }
      TPZFMatrix<double>::TPZFMatrix
                ((TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffe6574,in_stack_fffffffffffe6570)
                );
      TPZFMatrix<double>::TPZFMatrix
                ((TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffe6574,in_stack_fffffffffffe6570)
                );
      TPZFMatrix<double>::TPZFMatrix
                ((TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffe6574,in_stack_fffffffffffe6570)
                );
      iVar9 = TPZVec<TPZMaterialDataT<double>_>::size(aTStack_186d0);
      iVar5 = (int)iVar9;
      for (uVar16 = 0; (int)uVar16 < iVar4; uVar16 = uVar16 + 1) {
        pTVar15 = TPZAutoPointer<TPZIntPoints>::operator->(&TStack_19758);
        (*pTVar15->_vptr_TPZIntPoints[4])(pTVar15,(ulong)uVar16,auStack_197d0,adStack_197e0);
        TPZGeoEl::Jacobian(in_stack_fffffffffffe6660,in_stack_fffffffffffe6658,
                           in_stack_fffffffffffe6650,in_stack_fffffffffffe6648,
                           in_stack_fffffffffffe6640,in_stack_fffffffffffe6638);
        adStack_197e0[0] = ABS((double)in_stack_fffffffffffe65e0) * adStack_197e0[0];
        for (iStack_19a2c = 0; iStack_19a2c < iVar5; iStack_19a2c = iStack_19a2c + 1) {
          uVar17 = uVar16;
          pTVar12 = TPZVec<TPZMaterialDataT<double>_>::operator[](aTStack_186d0,(long)iStack_19a2c);
          (pTVar12->super_TPZMaterialData).intLocPtIndex = uVar16;
          in_stack_fffffffffffe6538 = uVar16;
          uVar16 = uVar17;
        }
        (**(code **)(*in_RDI + 0x2a8))(in_RDI,auStack_197d0,auStack_19748,aTStack_186d0);
        (**(code **)(*plVar7 + 0x70))(adStack_197e0[0],plVar7,aTStack_186d0,in_RSI + 0x1f0);
      }
      CleanupMaterialData(this_01,(TPZVec<TPZMaterialDataT<double>_> *)
                                  CONCAT44(iVar1,in_stack_fffffffffffe6538));
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1b719be);
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1b719cb);
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1b719d8);
      TPZManVector<int,_3>::~TPZManVector((TPZManVector<int,_3> *)this_01);
      TPZManVector<int,_3>::~TPZManVector((TPZManVector<int,_3> *)this_01);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)this_01);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)this_01);
      TPZAutoPointer<TPZIntPoints>::~TPZAutoPointer((TPZAutoPointer<TPZIntPoints> *)this_01);
      TPZManVector<TPZTransform<double>,_10>::~TPZManVector
                ((TPZManVector<TPZTransform<double>,_10> *)CONCAT44(iVar3,in_stack_fffffffffffe6550)
                );
      TPZManVector<TPZMaterialDataT<double>,_3>::~TPZManVector
                ((TPZManVector<TPZMaterialDataT<double>,_3> *)
                 CONCAT44(iVar3,in_stack_fffffffffffe6550));
    }
  }
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::CalcResidualT(TPZElementMatrixT<TVar> &ef)
{
    TPZMaterial * material = Material();
    auto *matCombined =
       dynamic_cast<TPZMatCombinedSpacesT<TVar>*>(material);
    if(!material || !matCombined){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        ef.Reset();
        return;
    }
    
    InitializeElementMatrix(ef);
    
    if (this->NConnects() == 0) return;//boundary discontinuous elements have this characteristic
    
    TPZManVector<TPZMaterialDataT<TVar>,3> datavec;
    const int64_t nref = fElementVec.size();
    datavec.resize(nref);
    InitMaterialData(datavec);
    
    TPZManVector<TPZTransform<> > trvec;
    AffineTransform(trvec);
    
    int dim = Dimension();
    TPZAutoPointer<TPZIntPoints> intrule;
    
    TPZManVector<REAL,3> intpoint(dim,0.), intpointtemp(dim,0.);
    REAL weight = 0.;
    
    TPZManVector<int,3> ordervec;
    //ordervec.resize(nref);
    for (int64_t iref=0;  iref<nref; iref++)
    {
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        int svec;
        if(msp)
        {
            ordervec.Resize(ordervec.size()+1);
            svec = ordervec.size();
        }
        else
        {
            continue;
        }
        datavec[iref].p = msp->MaxOrder();
        ordervec[svec-1] = datavec[iref].p;
    }
    int order = matCombined->IntegrationRuleOrder(ordervec);
    
    TPZGeoEl *ref = this->Reference();
    intrule = ref->CreateSideIntegrationRule(ref->NSides()-1, order);
    
    TPZManVector<int,3> intorder(dim,order);
    intrule->SetOrder(intorder);
    int intrulepoints = intrule->NPoints();
    if(intrulepoints > 1000) {
        DebugStop();
    }
    
    TPZFMatrix<REAL> jac, axe, jacInv;
    REAL detJac;
    int nmeshes = datavec.size();
    for(int int_ind = 0; int_ind < intrulepoints; ++int_ind)
    {
        intrule->Point(int_ind,intpointtemp,weight);
        ref->Jacobian(intpointtemp, jac, axe, detJac , jacInv);
        weight *= fabs(detJac);
        for (int imesh = 0; imesh < nmeshes; imesh++) {
            datavec[imesh].intLocPtIndex = int_ind;
        }
        
        
        this->ComputeRequiredData(intpointtemp,trvec,datavec);
        
        matCombined->Contribute(datavec,weight,ef.fMat);
    }//loop over integratin points
    
    CleanupMaterialData(datavec);
    
}